

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Toplex_map.h
# Opt level: O1

bool Gudhi::
     included<std::vector<unsigned_long,std::allocator<unsigned_long>>,std::set<unsigned_long,std::less<unsigned_long>,std::allocator<unsigned_long>>>
               (vector<unsigned_long,_std::allocator<unsigned_long>_> *vertex_range1,
               set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>
               *vertex_range2)

{
  pointer puVar1;
  size_type sVar2;
  Vertex *v;
  pointer __x;
  bool bVar3;
  Simplex s2;
  _Rb_tree<unsigned_long,_unsigned_long,_std::_Identity<unsigned_long>,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>
  local_50;
  
  std::set<unsigned_long,std::less<unsigned_long>,std::allocator<unsigned_long>>::
  set<std::_Rb_tree_const_iterator<unsigned_long>>
            ((set<unsigned_long,std::less<unsigned_long>,std::allocator<unsigned_long>> *)&local_50,
             (vertex_range2->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left,
             (_Rb_tree_const_iterator<unsigned_long>)
             &(vertex_range2->_M_t)._M_impl.super__Rb_tree_header);
  __x = (vertex_range1->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
        super__Vector_impl_data._M_start;
  puVar1 = (vertex_range1->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
           _M_impl.super__Vector_impl_data._M_finish;
  bVar3 = __x == puVar1;
  if (!bVar3) {
    do {
      sVar2 = std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>::
              count((set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_> *)
                    &local_50,__x);
      if (sVar2 == 0) break;
      __x = __x + 1;
      bVar3 = __x == puVar1;
    } while (!bVar3);
  }
  std::
  _Rb_tree<unsigned_long,_unsigned_long,_std::_Identity<unsigned_long>,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>
  ::~_Rb_tree(&local_50);
  return bVar3;
}

Assistant:

bool included(const Input_vertex_range1& vertex_range1, const Input_vertex_range2& vertex_range2) {
  Toplex_map::Simplex s2(vertex_range2.begin(), vertex_range2.end());
  for (const Toplex_map::Vertex& v : vertex_range1)
    if (!s2.count(v)) return false;
  return true;
}